

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

int __thiscall CEditorMap::Load(CEditorMap *this,IStorage *pStorage,char *pFileName,int StorageType)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  uint *puVar7;
  IGraphics *pIVar8;
  void *pvVar9;
  CLayerGroup *pCVar10;
  CMapItemLayerTilemap *v;
  CTile *pSavedTiles;
  CEnvPoint *pCVar11;
  int in_ECX;
  char *in_RDX;
  IStorage *in_RSI;
  CEditorMap *in_RDI;
  long in_FS_OFFSET;
  int c;
  CEnvPoint_v1 *pEnvPoint_v1;
  int n;
  int Channels;
  CMapItemEnvelope *pItem_3;
  int e;
  CEnvPoint *pEnvPoints;
  void *pData_2;
  CLayerQuads *pQuads;
  CMapItemLayerQuads *pQuadsItem;
  int i_1;
  void *pData_1;
  CLayerTiles *pTiles;
  CMapItemLayerTilemap *pTilemapItem;
  CMapItemLayer *pLayerItem;
  CLayer *pLayer;
  int l;
  CLayerGroup *pGroup;
  CMapItemGroup *pGItem;
  int g;
  void *pData;
  int DataSize;
  char *pName;
  CMapItemImage *pItem_2;
  int i;
  CMapItemInfo *pItem_1;
  CMapItemVersion *pItem;
  CEnvelope *pEnv;
  int Num_2;
  int Start_2;
  int Num_3;
  int Start_3;
  int Num_1;
  int Start_1;
  int LayersNum;
  int LayersStart;
  CEditorImage *pImg;
  int Num;
  int Start;
  CDataFileReader DataFile;
  CEditorImage ImgInfo;
  char aBuf [512];
  undefined4 in_stack_fffffffffffff968;
  uint in_stack_fffffffffffff96c;
  CEditorMap *in_stack_fffffffffffff970;
  int in_stack_fffffffffffff978;
  int in_stack_fffffffffffff97c;
  CEditorImage *in_stack_fffffffffffff980;
  int in_stack_fffffffffffff988;
  int in_stack_fffffffffffff98c;
  CEditorMap *in_stack_fffffffffffff990;
  CEditorImage *in_stack_fffffffffffff9f8;
  uint local_5a0;
  int local_504;
  int local_4f8;
  int local_4e4;
  void *local_4e0;
  int local_4bc;
  CLayerTiles *local_4b0;
  CLayerTiles *local_498;
  int local_48c;
  int local_474;
  int local_44c;
  int local_404;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  uint local_3d8;
  uint local_3d4;
  uint *local_3d0;
  int local_3c8;
  int local_3c4;
  CDataFileReader local_3c0;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  undefined8 local_3a8;
  char local_208 [512];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CDataFileReader::CDataFileReader(&local_3c0);
  bVar2 = CDataFileReader::Open(&local_3c0,in_RSI,in_RDX,in_ECX);
  if (bVar2) {
    Clean(in_stack_fffffffffffff970);
    piVar5 = (int *)CDataFileReader::FindItem
                              ((CDataFileReader *)in_stack_fffffffffffff990,
                               in_stack_fffffffffffff98c,in_stack_fffffffffffff988);
    if (piVar5 == (int *)0x0) {
      local_404 = 0;
    }
    else if (*piVar5 == 1) {
      piVar5 = (int *)CDataFileReader::FindItem
                                ((CDataFileReader *)in_stack_fffffffffffff990,
                                 in_stack_fffffffffffff98c,in_stack_fffffffffffff988);
      if ((piVar5 != (int *)0x0) && (*piVar5 == 1)) {
        if (-1 < piVar5[1]) {
          CDataFileReader::GetData
                    ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
          str_copy((char *)in_stack_fffffffffffff970,
                   (char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),0);
        }
        if (-1 < piVar5[2]) {
          CDataFileReader::GetData
                    ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
          str_copy((char *)in_stack_fffffffffffff970,
                   (char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),0);
        }
        if (-1 < piVar5[3]) {
          CDataFileReader::GetData
                    ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
          str_copy((char *)in_stack_fffffffffffff970,
                   (char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),0);
        }
        if (-1 < piVar5[4]) {
          CDataFileReader::GetData
                    ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
          str_copy((char *)in_stack_fffffffffffff970,
                   (char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),0);
        }
      }
      CDataFileReader::GetType(&local_3c0,2,&local_3c4,&local_3c8);
      for (local_44c = 0; local_44c < local_3c8; local_44c = local_44c + 1) {
        piVar5 = (int *)CDataFileReader::GetItem
                                  (&local_3c0,local_3c4 + local_44c,(int *)0x0,(int *)0x0);
        pvVar6 = CDataFileReader::GetData
                           ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
        puVar7 = (uint *)operator_new(0x1b0);
        CEditorImage::CEditorImage
                  ((CEditorImage *)in_stack_fffffffffffff970,
                   (CEditor *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        puVar7[9] = piVar5[3];
        local_3d0 = puVar7;
        if ((piVar5[3] == 0) && (((*piVar5 < 2 || (piVar5[6] == 0)) || (piVar5[6] == 1)))) {
          *puVar7 = piVar5[1];
          puVar7[1] = piVar5[2];
          if (*piVar5 == 1) {
            local_5a0 = 1;
          }
          else {
            local_5a0 = piVar5[6];
          }
          puVar7[2] = local_5a0;
          CImageInfo::GetPixelSize((CImageInfo *)0x20b55b);
          CDataFileReader::GetData
                    ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
          pvVar9 = mem_alloc(0);
          *(void **)(local_3d0 + 4) = pvVar9;
          mem_copy(in_stack_fffffffffffff970,
                   (void *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),0);
          pIVar8 = CEditor::Graphics(in_RDI->m_pEditor);
          in_stack_fffffffffffff968 = 8;
          local_3d8 = (*(pIVar8->super_IInterface)._vptr_IInterface[0x10])
                                (pIVar8,(ulong)*local_3d0,(ulong)local_3d0[1],(ulong)local_3d0[2],
                                 *(undefined8 *)(local_3d0 + 4),0xffffffff);
          local_3d0[8] = local_3d8;
        }
        else {
          str_format(local_208,0x200,"mapres/%s.png",pvVar6);
          CEditorImage::CEditorImage
                    ((CEditorImage *)in_stack_fffffffffffff970,
                     (CEditor *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          pIVar8 = CEditor::Graphics(in_RDI->m_pEditor);
          iVar3 = (*(pIVar8->super_IInterface)._vptr_IInterface[0xe])
                            (pIVar8,&local_3b8,local_208,0xffffffff);
          if (iVar3 != 0) {
            memcpy(local_3d0,&local_3b8,0x1b0);
            pIVar8 = CEditor::Graphics(in_RDI->m_pEditor);
            in_stack_fffffffffffff968 = 8;
            local_3d4 = (*(pIVar8->super_IInterface)._vptr_IInterface[0x10])
                                  (pIVar8,(ulong)local_3b8,(ulong)local_3b4,(ulong)local_3b0,
                                   local_3a8,0xffffffff);
            local_3d0[8] = local_3d4;
            local_3a8 = 0;
            local_3d0[9] = 1;
          }
          CEditorImage::~CEditorImage(in_stack_fffffffffffff980);
        }
        if (pvVar6 != (void *)0x0) {
          str_copy((char *)in_stack_fffffffffffff970,
                   (char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),0);
        }
        CEditorImage::LoadAutoMapper(in_stack_fffffffffffff9f8);
        array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::add
                  ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
                   in_stack_fffffffffffff970,
                   (CEditorImage **)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        CDataFileReader::UnloadData
                  ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
        CDataFileReader::UnloadData
                  ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
      }
      CDataFileReader::GetType(&local_3c0,5,&local_3dc,&local_3e0);
      CDataFileReader::GetType(&local_3c0,4,&local_3e4,&local_3e8);
      for (local_474 = 0; local_474 < local_3e8; local_474 = local_474 + 1) {
        piVar5 = (int *)CDataFileReader::GetItem
                                  (&local_3c0,local_3e4 + local_474,(int *)0x0,(int *)0x0);
        if ((0 < *piVar5) && (*piVar5 < 4)) {
          pCVar10 = NewGroup(in_stack_fffffffffffff990);
          pCVar10->m_ParallaxX = piVar5[3];
          pCVar10->m_ParallaxY = piVar5[4];
          pCVar10->m_OffsetX = piVar5[1];
          pCVar10->m_OffsetY = piVar5[2];
          if (1 < *piVar5) {
            pCVar10->m_UseClipping = piVar5[7];
            pCVar10->m_ClipX = piVar5[8];
            pCVar10->m_ClipY = piVar5[9];
            pCVar10->m_ClipW = piVar5[10];
            pCVar10->m_ClipH = piVar5[0xb];
          }
          if (2 < *piVar5) {
            IntsToStr(piVar5 + 0xc,3,pCVar10->m_aName);
          }
          for (local_48c = 0; local_48c < piVar5[6]; local_48c = local_48c + 1) {
            local_498 = (CLayerTiles *)0x0;
            v = (CMapItemLayerTilemap *)
                CDataFileReader::GetItem
                          (&local_3c0,local_3dc + piVar5[5] + local_48c,(int *)0x0,(int *)0x0);
            if (v != (CMapItemLayerTilemap *)0x0) {
              if ((v->m_Layer).m_Type == 2) {
                if ((v->m_Flags & 1U) == 0) {
                  local_4b0 = (CLayerTiles *)operator_new(0x80);
                  CLayerTiles::CLayerTiles
                            ((CLayerTiles *)in_stack_fffffffffffff990,in_stack_fffffffffffff98c,
                             in_stack_fffffffffffff988);
                  (local_4b0->super_CLayer).m_pEditor = in_RDI->m_pEditor;
                  iVar3 = (v->m_Color).g;
                  (local_4b0->m_Color).r = (v->m_Color).r;
                  (local_4b0->m_Color).g = iVar3;
                  iVar3 = (v->m_Color).a;
                  (local_4b0->m_Color).b = (v->m_Color).b;
                  (local_4b0->m_Color).a = iVar3;
                  local_4b0->m_ColorEnv = v->m_ColorEnv;
                  local_4b0->m_ColorEnvOffset = v->m_ColorEnvOffset;
                }
                else {
                  local_4b0 = (CLayerTiles *)operator_new(0x80);
                  CLayerGame::CLayerGame
                            ((CLayerGame *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
                             in_stack_fffffffffffff978);
                  MakeGameLayer(in_RDI,&local_4b0->super_CLayer);
                  MakeGameGroup(in_stack_fffffffffffff970,
                                (CLayerGroup *)
                                CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                }
                local_498 = local_4b0;
                CLayerGroup::AddLayer
                          ((CLayerGroup *)0x20bb75,
                           (CLayer *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                pSavedTiles = (CTile *)CDataFileReader::GetData
                                                 ((CDataFileReader *)in_stack_fffffffffffff970,
                                                  in_stack_fffffffffffff96c);
                local_4b0->m_Image = v->m_Image;
                local_4b0->m_Game = v->m_Flags & 1;
                if (2 < v->m_Version) {
                  IntsToStr(v->m_aName,3,(local_4b0->super_CLayer).m_aName);
                }
                if (v->m_Version < 4) {
                  mem_copy(in_stack_fffffffffffff970,
                           (void *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),0);
                }
                else {
                  CLayerTiles::ExtractTiles(local_4b0,pSavedTiles);
                }
                if ((local_4b0->m_Game != 0) &&
                   (iVar3 = v->m_Version, iVar4 = MakeVersion<CMapItemLayerTilemap>(1,v),
                   iVar3 == iVar4)) {
                  for (local_4bc = 0; local_4bc < local_4b0->m_Width * local_4b0->m_Height;
                      local_4bc = local_4bc + 1) {
                    if (local_4b0->m_pTiles[local_4bc].m_Index != '\0') {
                      local_4b0->m_pTiles[local_4bc].m_Index =
                           local_4b0->m_pTiles[local_4bc].m_Index + 0xbf;
                    }
                  }
                }
                CDataFileReader::UnloadData
                          ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
              }
              else if ((v->m_Layer).m_Type == 3) {
                local_498 = (CLayerTiles *)operator_new(0x40);
                CLayerQuads::CLayerQuads((CLayerQuads *)in_stack_fffffffffffff980);
                (local_498->super_CLayer).m_pEditor = in_RDI->m_pEditor;
                (local_498->m_Texture).m_Id = v->m_Flags;
                if (((local_498->m_Texture).m_Id < -1) ||
                   (iVar3 = (local_498->m_Texture).m_Id,
                   iVar4 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                                     (&in_RDI->m_lImages), iVar4 <= iVar3)) {
                  (local_498->m_Texture).m_Id = -1;
                }
                if (1 < v->m_Version) {
                  IntsToStr(&(v->m_Color).r,3,(local_498->super_CLayer).m_aName);
                }
                CDataFileReader::GetDataSwapped
                          ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
                CLayerGroup::AddLayer
                          ((CLayerGroup *)0x20bedc,
                           (CLayer *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
                array<CQuad,_allocator_default<CQuad>_>::set_size
                          ((array<CQuad,_allocator_default<CQuad>_> *)in_stack_fffffffffffff970,
                           in_stack_fffffffffffff96c);
                array<CQuad,_allocator_default<CQuad>_>::base_ptr
                          ((array<CQuad,_allocator_default<CQuad>_> *)&local_498->m_Image);
                mem_copy(in_stack_fffffffffffff970,
                         (void *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),0);
                CDataFileReader::UnloadData
                          ((CDataFileReader *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
              }
              if (local_498 != (CLayerTiles *)0x0) {
                (local_498->super_CLayer).m_Flags = (v->m_Layer).m_Flags;
              }
            }
          }
        }
      }
      local_4e0 = (void *)0x0;
      CDataFileReader::GetType(&local_3c0,6,&local_3ec,&local_3f0);
      if (local_3f0 != 0) {
        local_4e0 = CDataFileReader::GetItem(&local_3c0,local_3ec,(int *)0x0,(int *)0x0);
      }
      CDataFileReader::GetType(&local_3c0,3,&local_3f4,&local_3f8);
      for (local_4e4 = 0; local_4e4 < local_3f8; local_4e4 = local_4e4 + 1) {
        piVar5 = (int *)CDataFileReader::GetItem
                                  (&local_3c0,local_3f4 + local_4e4,(int *)0x0,(int *)0x0);
        iVar3 = minimum<int>(piVar5[1],4);
        pvVar6 = operator_new(0x48);
        CEnvelope::CEnvelope((CEnvelope *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
        array<CEnvPoint,_allocator_default<CEnvPoint>_>::set_size
                  ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)in_stack_fffffffffffff970,
                   in_stack_fffffffffffff96c);
        for (local_4f8 = 0; local_4f8 < piVar5[3]; local_4f8 = local_4f8 + 1) {
          if (*piVar5 < 3) {
            piVar1 = (int *)((long)local_4e0 + (long)(piVar5[2] + local_4f8) * 0x18);
            array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                      ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)((long)pvVar6 + 8),
                       local_4f8);
            mem_zero(in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
            iVar4 = *piVar1;
            pCVar11 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                                ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                                 ((long)pvVar6 + 8),local_4f8);
            (pCVar11->super_CEnvPoint_v1).m_Time = iVar4;
            iVar4 = piVar1[1];
            pCVar11 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                                ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                                 ((long)pvVar6 + 8),local_4f8);
            (pCVar11->super_CEnvPoint_v1).m_Curvetype = iVar4;
            for (local_504 = 0; local_504 < iVar3; local_504 = local_504 + 1) {
              iVar4 = piVar1[(long)local_504 + 2];
              pCVar11 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                                  ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                                   ((long)pvVar6 + 8),local_4f8);
              (pCVar11->super_CEnvPoint_v1).m_aValues[local_504] = iVar4;
            }
          }
          else {
            iVar4 = piVar5[2];
            pCVar11 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                                ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)
                                 ((long)pvVar6 + 8),local_4f8);
            memcpy(pCVar11,(void *)((long)local_4e0 + (long)(iVar4 + local_4f8) * 0x58),0x58);
          }
        }
        if (piVar5[4] != -1) {
          IntsToStr(piVar5 + 4,8,(char *)((long)pvVar6 + 0x18));
        }
        array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::add
                  ((array<CEnvelope_*,_allocator_default<CEnvelope_*>_> *)in_stack_fffffffffffff970,
                   (CEnvelope **)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        if (1 < *piVar5) {
          *(bool *)((long)pvVar6 + 0x40) = piVar5[0xc] != 0;
        }
      }
      local_404 = 1;
    }
    else {
      local_404 = 0;
    }
  }
  else {
    local_404 = 0;
  }
  CDataFileReader::~CDataFileReader((CDataFileReader *)0x20c3f2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_404;
}

Assistant:

int CEditorMap::Load(class IStorage *pStorage, const char *pFileName, int StorageType)
{
	CDataFileReader DataFile;
	if(!DataFile.Open(pStorage, pFileName, StorageType))
		return 0;

	Clean();

	// check version
	CMapItemVersion *pItem = (CMapItemVersion *)DataFile.FindItem(MAPITEMTYPE_VERSION, 0);
	if(!pItem)
	{
		return 0;
	}
	else if(pItem->m_Version == CMapItemVersion::CURRENT_VERSION)
	{
		// load map info
		{
			CMapItemInfo *pItem = (CMapItemInfo *)DataFile.FindItem(MAPITEMTYPE_INFO, 0);
			if(pItem && pItem->m_Version == 1)
			{
				if(pItem->m_Author > -1)
					str_copy(m_MapInfo.m_aAuthor, (char *)DataFile.GetData(pItem->m_Author), sizeof(m_MapInfo.m_aAuthor));
				if(pItem->m_MapVersion > -1)
					str_copy(m_MapInfo.m_aVersion, (char *)DataFile.GetData(pItem->m_MapVersion), sizeof(m_MapInfo.m_aVersion));
				if(pItem->m_Credits > -1)
					str_copy(m_MapInfo.m_aCredits, (char *)DataFile.GetData(pItem->m_Credits), sizeof(m_MapInfo.m_aCredits));
				if(pItem->m_License > -1)
					str_copy(m_MapInfo.m_aLicense, (char *)DataFile.GetData(pItem->m_License), sizeof(m_MapInfo.m_aLicense));
			}
		}

		// load images
		{
			int Start, Num;
			DataFile.GetType( MAPITEMTYPE_IMAGE, &Start, &Num);
			for(int i = 0; i < Num; i++)
			{
				CMapItemImage *pItem = (CMapItemImage *)DataFile.GetItem(Start+i, 0, 0);
				char *pName = (char *)DataFile.GetData(pItem->m_ImageName);

				// copy base info
				CEditorImage *pImg = new CEditorImage(m_pEditor);
				pImg->m_External = pItem->m_External;

				if(pItem->m_External || (pItem->m_Version > 1 && pItem->m_Format != CImageInfo::FORMAT_RGB && pItem->m_Format != CImageInfo::FORMAT_RGBA))
				{
					char aBuf[IO_MAX_PATH_LENGTH];
					str_format(aBuf, sizeof(aBuf),"mapres/%s.png", pName);

					// load external
					CEditorImage ImgInfo(m_pEditor);
					if(m_pEditor->Graphics()->LoadPNG(&ImgInfo, aBuf, IStorage::TYPE_ALL))
					{
						*pImg = ImgInfo;
						pImg->m_Texture = m_pEditor->Graphics()->LoadTextureRaw(ImgInfo.m_Width, ImgInfo.m_Height, ImgInfo.m_Format, ImgInfo.m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
						ImgInfo.m_pData = 0;
						pImg->m_External = 1;
					}
				}
				else
				{
					pImg->m_Width = pItem->m_Width;
					pImg->m_Height = pItem->m_Height;
					pImg->m_Format = pItem->m_Version == 1 ? CImageInfo::FORMAT_RGBA : pItem->m_Format;

					// copy image data
					const int DataSize = pImg->m_Width * pImg->m_Height * pImg->GetPixelSize();
					void *pData = DataFile.GetData(pItem->m_ImageData);
					pImg->m_pData = mem_alloc(DataSize);
					mem_copy(pImg->m_pData, pData, DataSize);
					pImg->m_Texture = m_pEditor->Graphics()->LoadTextureRaw(pImg->m_Width, pImg->m_Height, pImg->m_Format, pImg->m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
				}

				// copy image name
				if(pName)
					str_copy(pImg->m_aName, pName, 128);

				// load auto mapper file
				pImg->LoadAutoMapper();

				m_lImages.add(pImg);

				// unload image
				DataFile.UnloadData(pItem->m_ImageData);
				DataFile.UnloadData(pItem->m_ImageName);
			}
		}

		// load groups
		{
			int LayersStart, LayersNum;
			DataFile.GetType(MAPITEMTYPE_LAYER, &LayersStart, &LayersNum);

			int Start, Num;
			DataFile.GetType(MAPITEMTYPE_GROUP, &Start, &Num);
			for(int g = 0; g < Num; g++)
			{
				CMapItemGroup *pGItem = (CMapItemGroup *)DataFile.GetItem(Start+g, 0, 0);

				if(pGItem->m_Version < 1 || pGItem->m_Version > CMapItemGroup::CURRENT_VERSION)
					continue;

				CLayerGroup *pGroup = NewGroup();
				pGroup->m_ParallaxX = pGItem->m_ParallaxX;
				pGroup->m_ParallaxY = pGItem->m_ParallaxY;
				pGroup->m_OffsetX = pGItem->m_OffsetX;
				pGroup->m_OffsetY = pGItem->m_OffsetY;

				if(pGItem->m_Version >= 2)
				{
					pGroup->m_UseClipping = pGItem->m_UseClipping;
					pGroup->m_ClipX = pGItem->m_ClipX;
					pGroup->m_ClipY = pGItem->m_ClipY;
					pGroup->m_ClipW = pGItem->m_ClipW;
					pGroup->m_ClipH = pGItem->m_ClipH;
				}

				// load group name
				if(pGItem->m_Version >= 3)
					IntsToStr(pGItem->m_aName, sizeof(pGroup->m_aName)/sizeof(int), pGroup->m_aName);

				for(int l = 0; l < pGItem->m_NumLayers; l++)
				{
					CLayer *pLayer = 0;
					CMapItemLayer *pLayerItem = (CMapItemLayer *)DataFile.GetItem(LayersStart+pGItem->m_StartLayer+l, 0, 0);
					if(!pLayerItem)
						continue;

					if(pLayerItem->m_Type == LAYERTYPE_TILES)
					{
						CMapItemLayerTilemap *pTilemapItem = (CMapItemLayerTilemap *)pLayerItem;
						CLayerTiles *pTiles = 0;

						if(pTilemapItem->m_Flags&TILESLAYERFLAG_GAME)
						{
							pTiles = new CLayerGame(pTilemapItem->m_Width, pTilemapItem->m_Height);
							MakeGameLayer(pTiles);
							MakeGameGroup(pGroup);
						}
						else
						{
							pTiles = new CLayerTiles(pTilemapItem->m_Width, pTilemapItem->m_Height);
							pTiles->m_pEditor = m_pEditor;
							pTiles->m_Color = pTilemapItem->m_Color;
							pTiles->m_ColorEnv = pTilemapItem->m_ColorEnv;
							pTiles->m_ColorEnvOffset = pTilemapItem->m_ColorEnvOffset;
						}

						pLayer = pTiles;

						pGroup->AddLayer(pTiles);
						void *pData = DataFile.GetData(pTilemapItem->m_Data);
						pTiles->m_Image = pTilemapItem->m_Image;
						pTiles->m_Game = pTilemapItem->m_Flags&TILESLAYERFLAG_GAME;

						// load layer name
						if(pTilemapItem->m_Version >= 3)
							IntsToStr(pTilemapItem->m_aName, sizeof(pTiles->m_aName)/sizeof(int), pTiles->m_aName);

						// get tile data
						if(pTilemapItem->m_Version > 3)
							pTiles->ExtractTiles((CTile *)pData);
						else
							mem_copy(pTiles->m_pTiles, pData, pTiles->m_Width*pTiles->m_Height*sizeof(CTile));


						if(pTiles->m_Game && pTilemapItem->m_Version == MakeVersion(1, *pTilemapItem))
						{
							for(int i = 0; i < pTiles->m_Width*pTiles->m_Height; i++)
							{
								if(pTiles->m_pTiles[i].m_Index)
									pTiles->m_pTiles[i].m_Index += ENTITY_OFFSET;
							}
						}

						DataFile.UnloadData(pTilemapItem->m_Data);
					}
					else if(pLayerItem->m_Type == LAYERTYPE_QUADS)
					{
						CMapItemLayerQuads *pQuadsItem = (CMapItemLayerQuads *)pLayerItem;
						CLayerQuads *pQuads = new CLayerQuads;
						pQuads->m_pEditor = m_pEditor;
						pLayer = pQuads;
						pQuads->m_Image = pQuadsItem->m_Image;
						if(pQuads->m_Image < -1 || pQuads->m_Image >= m_lImages.size())
							pQuads->m_Image = -1;

						// load layer name
						if(pQuadsItem->m_Version >= 2)
							IntsToStr(pQuadsItem->m_aName, sizeof(pQuads->m_aName)/sizeof(int), pQuads->m_aName);

						void *pData = DataFile.GetDataSwapped(pQuadsItem->m_Data);
						pGroup->AddLayer(pQuads);
						pQuads->m_lQuads.set_size(pQuadsItem->m_NumQuads);
						mem_copy(pQuads->m_lQuads.base_ptr(), pData, sizeof(CQuad)*pQuadsItem->m_NumQuads);
						DataFile.UnloadData(pQuadsItem->m_Data);
					}

					if(pLayer)
						pLayer->m_Flags = pLayerItem->m_Flags;
				}
			}
		}

		// load envelopes
		{
			CEnvPoint *pEnvPoints = 0;
			{
				int Start, Num;
				DataFile.GetType(MAPITEMTYPE_ENVPOINTS, &Start, &Num);
				if(Num)
					pEnvPoints = (CEnvPoint *)DataFile.GetItem(Start, 0, 0);
			}

			int Start, Num;
			DataFile.GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);
			for(int e = 0; e < Num; e++)
			{
				CMapItemEnvelope *pItem = (CMapItemEnvelope *)DataFile.GetItem(Start+e, 0, 0);
				const int Channels = minimum(pItem->m_Channels, 4);
				CEnvelope *pEnv = new CEnvelope(Channels);
				pEnv->m_lPoints.set_size(pItem->m_NumPoints);
				for(int n = 0; n < pItem->m_NumPoints; n++)
				{
					if(pItem->m_Version >= 3)
					{
						pEnv->m_lPoints[n] = pEnvPoints[pItem->m_StartPoint + n];
					}
					else
					{
						// backwards compatibility
						CEnvPoint_v1 *pEnvPoint_v1 = &((CEnvPoint_v1 *)pEnvPoints)[pItem->m_StartPoint + n];
						mem_zero((void*)&pEnv->m_lPoints[n], sizeof(CEnvPoint));

						pEnv->m_lPoints[n].m_Time = pEnvPoint_v1->m_Time;
						pEnv->m_lPoints[n].m_Curvetype = pEnvPoint_v1->m_Curvetype;

						for(int c = 0; c < Channels; c++)
						{
							pEnv->m_lPoints[n].m_aValues[c] = pEnvPoint_v1->m_aValues[c];
						}
					}
				}

				if(pItem->m_aName[0] != -1)	// compatibility with old maps
					IntsToStr(pItem->m_aName, sizeof(pItem->m_aName)/sizeof(int), pEnv->m_aName);
				m_lEnvelopes.add(pEnv);
				if(pItem->m_Version >= 2)
					pEnv->m_Synchronized = pItem->m_Synchronized;
			}
		}
	}
	else
		return 0;

	return 1;
}